

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

int __thiscall
higan::TimerManager::GetTimeoutTimer
          (TimerManager *this,vector<higan::Timer,_std::allocator<higan::Timer>_> *timeout_timers)

{
  _Invoker_type *this_00;
  value_type *__x;
  pointer pcVar1;
  bool bVar2;
  int64_t iVar3;
  int iVar4;
  undefined1 local_88 [8];
  Timer new_timer;
  TimeStamp now;
  
  iVar4 = 0;
  if ((timeout_timers != (vector<higan::Timer,_std::allocator<higan::Timer>_> *)0x0) &&
     (iVar4 = 0,
     (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
     super__Vector_impl_data._M_start !=
     (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    iVar3 = TimeStamp::Now();
    this_00 = &new_timer.timer_callback_._M_invoker;
    TimeStamp::TimeStamp((TimeStamp *)this_00,iVar3);
    (this->min_expire_time).microsecond_time_ =
         (((this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_start)->expire_time_).microsecond_time_;
    bVar2 = TimeStamp::operator<((TimeStamp *)this_00,&this->min_expire_time);
    iVar4 = 0;
    if (!bVar2) {
      iVar4 = 0;
      while ((this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = TimeStamp::operator<=
                          (&this->min_expire_time,(TimeStamp *)&new_timer.timer_callback_._M_invoker
                          );
        if (!bVar2) break;
        __x = (this->timer_queue_).c.super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>
              ._M_impl.super__Vector_impl_data._M_start;
        (this->min_expire_time).microsecond_time_ = (__x->expire_time_).microsecond_time_;
        std::vector<higan::Timer,_std::allocator<higan::Timer>_>::push_back(timeout_timers,__x);
        if (__x->repeat_ == true) {
          local_88 = (undefined1  [8])&new_timer.name_._M_string_length;
          pcVar1 = (__x->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_88,pcVar1,pcVar1 + (__x->name_)._M_string_length);
          iVar3 = (__x->expire_time_).microsecond_time_;
          new_timer.expire_time_.microsecond_time_._0_5_ =
               (undefined5)
               ((ulong)*(undefined8 *)((long)&(__x->expire_time_).microsecond_time_ + 5) >> 0x18);
          new_timer.name_.field_2._8_5_ = (undefined5)iVar3;
          new_timer.name_.field_2._13_3_ = (undefined3)((ulong)iVar3 >> 0x28);
          std::function<void_(const_higan::Timer_&)>::function
                    ((function<void_(const_higan::Timer_&)> *)&new_timer.timeout_,
                     &__x->timer_callback_);
          Timer::AdjustExpireTime((Timer *)local_88);
          std::vector<higan::Timer,_std::allocator<higan::Timer>_>::push_back
                    ((vector<higan::Timer,_std::allocator<higan::Timer>_> *)this,
                     (value_type *)local_88);
          std::
          push_heap<__gnu_cxx::__normal_iterator<higan::Timer*,std::vector<higan::Timer,std::allocator<higan::Timer>>>,std::less<higan::Timer>>
                    ((this->timer_queue_).c.
                     super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->timer_queue_).c.
                     super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          (this->min_expire_time).microsecond_time_ =
               (((this->timer_queue_).c.
                 super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
                 super__Vector_impl_data._M_start)->expire_time_).microsecond_time_;
          Timer::~Timer((Timer *)local_88);
        }
        iVar4 = iVar4 + 1;
        std::
        priority_queue<higan::Timer,_std::vector<higan::Timer,_std::allocator<higan::Timer>_>,_std::less<higan::Timer>_>
        ::pop(&this->timer_queue_);
      }
    }
    TimeStamp::~TimeStamp((TimeStamp *)&new_timer.timer_callback_._M_invoker);
  }
  return iVar4;
}

Assistant:

int TimerManager::GetTimeoutTimer(std::vector<Timer>* timeout_timers)
{
	if (timer_queue_.empty() || timeout_timers == nullptr)
	{
		return 0;
	}

	TimeStamp now(TimeStamp::Now());
	min_expire_time = timer_queue_.top().GetExpireTime();

	if (now < min_expire_time)
	{
		return 0;
	}

	int result_count = 0;

	while (!timer_queue_.empty() && min_expire_time <= now)
	{
		result_count++;

		const Timer& timer = timer_queue_.top();
		min_expire_time = timer.GetExpireTime();

		timeout_timers->push_back(timer);

		if (timer.Repeat())
		{
			Timer new_timer(timer);
			new_timer.AdjustExpireTime();
			Insert(new_timer);
		}

		timer_queue_.pop();
	}

	return result_count;
}